

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O2

Reflection * google::protobuf::internal::GetReflectionOrDie(Message *m)

{
  ushort *puVar1;
  LogMessage *pLVar2;
  char *pcVar3;
  ulong uVar4;
  Metadata MVar5;
  string_view v;
  LogMessage local_20;
  
  MVar5 = Message::GetMetadata(m);
  if (MVar5.reflection != (Reflection *)0x0) {
    return MVar5.reflection;
  }
  MVar5 = Message::GetMetadata(m);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_ops.cc"
             ,0x26);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (&local_20,(char (*) [43])"Message does not support reflection (type ");
  if (MVar5.descriptor == (Descriptor *)0x0) {
    uVar4 = 7;
    pcVar3 = "unknown";
  }
  else {
    puVar1 = (ushort *)((MVar5.descriptor)->all_names_).payload_;
    uVar4 = (ulong)*puVar1;
    pcVar3 = (char *)((long)puVar1 + ~uVar4);
  }
  v._M_str = pcVar3;
  v._M_len = uVar4;
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,v);
  absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,(char (*) [3])0x370137);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_20);
}

Assistant:

static const Reflection* GetReflectionOrDie(const Message& m) {
  const Reflection* r = m.GetReflection();
  if (r == nullptr) {
    const Descriptor* d = m.GetDescriptor();
    // RawMessage is one known type for which GetReflection() returns nullptr.
    ABSL_LOG(FATAL) << "Message does not support reflection (type "
                    << (d ? d->name() : "unknown") << ").";
  }
  return r;
}